

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O1

void __thiscall
llvm::SmallPtrSetImplBase::SmallPtrSetImplBase
          (SmallPtrSetImplBase *this,void **SmallStorage,SmallPtrSetImplBase *that)

{
  uint *puVar1;
  
  this->SmallArray = SmallStorage;
  if (that->CurArray != that->SmallArray) {
    SmallStorage = (void **)malloc((ulong)that->CurArraySize << 3);
    if (SmallStorage == (void **)0x0) {
      report_bad_alloc_error("Allocation failed",true);
    }
  }
  this->CurArray = SmallStorage;
  this->CurArraySize = that->CurArraySize;
  puVar1 = &that->CurArraySize;
  if (that->CurArray == that->SmallArray) {
    puVar1 = &that->NumNonEmpty;
  }
  if (*puVar1 != 0) {
    memmove(this->CurArray,that->CurArray,(ulong)*puVar1 << 3);
  }
  this->NumNonEmpty = that->NumNonEmpty;
  this->NumTombstones = that->NumTombstones;
  return;
}

Assistant:

SmallPtrSetImplBase::SmallPtrSetImplBase(const void **SmallStorage,
                                         const SmallPtrSetImplBase &that) {
  SmallArray = SmallStorage;

  // If we're becoming small, prepare to insert into our stack space
  if (that.isSmall()) {
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else {
    CurArray = (const void**)safe_malloc(sizeof(void*) * that.CurArraySize);
  }

  // Copy over the that array.
  CopyHelper(that);
}